

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Genome::AddRnaseSite(Genome *this,int start,int stop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  __l;
  shared_ptr<BindingSite> rnase_site;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  binding;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_48;
  
  paVar1 = &local_70.first.field_2;
  local_78 = stop;
  local_74 = start;
  local_70.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"__rnase","");
  local_70.second = this->transcript_degradation_rate_;
  __l._M_len = 1;
  __l._M_array = &local_70;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)&local_48,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_80,(allocator_type *)&local_7c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.first._M_dataplus._M_p);
  }
  local_70.first._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<BindingSite,std::allocator<BindingSite>,char_const(&)[13],int&,int&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70.first._M_string_length,
             (BindingSite **)&local_70,(allocator<BindingSite> *)&local_80,
             (char (*) [13])"__rnase_site",&local_74,&local_78,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&local_48);
  std::__shared_ptr<BindingSite,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<BindingSite,BindingSite>
            ((__shared_ptr<BindingSite,(__gnu_cxx::_Lock_policy)2> *)&local_70,
             (BindingSite *)local_70.first._M_dataplus._M_p);
  local_80 = *(int *)(local_70.first._M_dataplus._M_p + 0x38);
  local_7c = *(int *)(local_70.first._M_dataplus._M_p + 0x3c);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
  ::emplace_back<int,int,std::shared_ptr<BindingSite>&>
            ((vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
              *)&this->transcript_rbs_intervals_,&local_80,&local_7c,
             (shared_ptr<BindingSite> *)&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.first._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.first._M_string_length);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_48);
  return;
}

Assistant:

void Genome::AddRnaseSite(int start, int stop) {
  auto binding =
      std::map<std::string, double>{{"__rnase", transcript_degradation_rate_}};
  auto rnase_site =
      std::make_shared<BindingSite>("__rnase_site", start, stop, binding);
  transcript_rbs_intervals_.emplace_back(rnase_site->start(),
                                         rnase_site->stop(), rnase_site);
}